

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O2

idx_t __thiscall duckdb::ReservoirSample::GetActiveSampleCount(ReservoirSample *this)

{
  SamplingState SVar1;
  pointer pBVar2;
  idx_t iVar3;
  
  SVar1 = GetSamplingState(this);
  if (SVar1 == RANDOM) {
    iVar3 = this->sel_size;
  }
  else {
    pBVar2 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(&(this->super_BlockingSample).base_reservoir_sample);
    iVar3 = (long)(pBVar2->reservoir_weights).c.
                  super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pBVar2->reservoir_weights).c.
                  super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
  }
  return iVar3;
}

Assistant:

idx_t ReservoirSample::GetActiveSampleCount() const {
	switch (GetSamplingState()) {
	case SamplingState::RANDOM:
		return sel_size;
	case SamplingState::RESERVOIR:
		return base_reservoir_sample->reservoir_weights.size();
	default:
		throw InternalException("Sampling State is INVALID");
	}
}